

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O3

void do_rastrip(CHAR_DATA *ch,char *argument)

{
  ROOM_AFFECT_DATA *pRVar1;
  ROOM_AFFECT_DATA *paf;
  ROOM_INDEX_DATA *room;
  
  if (((*argument != '\0') || (room = ch->in_room, room == (ROOM_INDEX_DATA *)0x0)) &&
     (room = find_location(ch,argument), room == (ROOM_INDEX_DATA *)0x0)) {
    send_to_char("No such room exists.\n\r",ch);
    return;
  }
  paf = room->affected;
  while (paf != (ROOM_AFFECT_DATA *)0x0) {
    pRVar1 = paf->next;
    affect_remove_room(room,paf);
    paf = pRVar1;
  }
  act("All affects stripped from \'$t\'.",ch,room->name,(void *)0x0,3);
  return;
}

Assistant:

void do_rastrip(CHAR_DATA *ch, char *argument)
{
	ROOM_AFFECT_DATA *af, *af_next;
	ROOM_INDEX_DATA *location = nullptr;

	if (argument[0] == '\0')
		location = ch->in_room;

	if (location == nullptr && (location = find_location(ch, argument)) == nullptr)
	{
		send_to_char("No such room exists.\n\r", ch);
		return;
	}

	for (af = location->affected; af != nullptr; af = af_next)
	{
		af_next = af->next;
		affect_remove_room(location, af);
	}

	act("All affects stripped from '$t'.", ch, location->name, 0, TO_CHAR);
}